

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaGlitch.c
# Opt level: O2

void Gli_ManSimulateSeqPref(Gli_Man_t *p,int nPref)

{
  uint uVar1;
  Gli_Obj_t *pGVar2;
  Gli_Obj_t *pGVar3;
  uint *puVar4;
  Gli_Man_t *p_00;
  int iVar5;
  int iVar6;
  long lVar7;
  ulong uVar8;
  
  iVar5 = 0;
  p_00 = p;
  while ((iVar5 < p->vCis->nSize - p->nRegs &&
         (p_00 = p, pGVar2 = Gli_ManCi(p,iVar5), pGVar2 != (Gli_Obj_t *)0x0))) {
    p_00 = (Gli_Man_t *)0x0;
    uVar1 = Gia_ManRandom(0);
    pGVar2->uSimInfo = uVar1;
    iVar5 = iVar5 + 1;
  }
  iVar5 = 0;
  while ((iVar5 < p->nRegs &&
         (p_00 = p, pGVar2 = Gli_ManCi(p,(p->vCis->nSize - p->nRegs) + iVar5),
         pGVar2 != (Gli_Obj_t *)0x0))) {
    pGVar2->uSimInfo = 0;
    iVar5 = iVar5 + 1;
  }
  iVar5 = 0;
  if (nPref < 1) {
    nPref = iVar5;
  }
  for (; iVar5 != nPref; iVar5 = iVar5 + 1) {
    uVar8 = 0;
    while (((int)uVar8 < p->nObjData && (p->pObjData != (int *)0x0))) {
      pGVar2 = (Gli_Obj_t *)(p->pObjData + uVar8);
      uVar1 = *(uint *)pGVar2;
      if ((uVar1 & 1) == 0) {
        uVar1 = Gli_ManSimulateSeqNode(p_00,pGVar2);
        pGVar2->uSimInfo = uVar1;
        uVar1 = *(uint *)pGVar2;
      }
      uVar8 = (ulong)((int)uVar8 + (uVar1 >> 7) + (uVar1 >> 4 & 7) + 7);
    }
    iVar6 = 0;
    while ((iVar6 < p->nRegs &&
           (p_00 = p, pGVar2 = Gli_ManCo(p,(p->vCos->nSize - p->nRegs) + iVar6),
           pGVar2 != (Gli_Obj_t *)0x0))) {
      pGVar2->uSimInfo = *(uint *)((long)pGVar2 + (long)*(int *)(pGVar2 + 1) * -4 + 0x10);
      iVar6 = iVar6 + 1;
    }
    iVar6 = 0;
    while ((iVar6 < p->vCis->nSize - p->nRegs &&
           (p_00 = p, pGVar2 = Gli_ManCi(p,iVar6), pGVar2 != (Gli_Obj_t *)0x0))) {
      p_00 = (Gli_Man_t *)0x0;
      uVar1 = Gia_ManRandom(0);
      pGVar2->uSimInfo = uVar1;
      iVar6 = iVar6 + 1;
    }
    iVar6 = 0;
    while (((iVar6 < p->nRegs &&
            (p_00 = p, pGVar2 = Gli_ManCo(p,(p->vCos->nSize - p->nRegs) + iVar6),
            pGVar2 != (Gli_Obj_t *)0x0)) &&
           (p_00 = p, pGVar3 = Gli_ManCi(p,(p->vCis->nSize - p->nRegs) + iVar6),
           pGVar3 != (Gli_Obj_t *)0x0))) {
      pGVar3->uSimInfo = pGVar2->uSimInfo;
      iVar6 = iVar6 + 1;
    }
  }
  if (p->pSimInfoPrev == (uint *)0x0) {
    puVar4 = (uint *)malloc((long)p->vCis->nSize << 2);
    p->pSimInfoPrev = puVar4;
  }
  lVar7 = 0;
  while( true ) {
    if (p->vCis->nSize <= lVar7) {
      return;
    }
    iVar5 = Vec_IntEntry(p->vCis,(int)lVar7);
    if (p->pObjData == (int *)0x0) break;
    p->pSimInfoPrev[lVar7] = p->pObjData[(long)iVar5 + 4];
    lVar7 = lVar7 + 1;
  }
  return;
}

Assistant:

void Gli_ManSimulateSeqPref( Gli_Man_t * p, int nPref )
{
    Gli_Obj_t * pObj, * pObjRi, * pObjRo;
    int i, f;
    // initialize simulation data
    Gli_ManForEachPi( p, pObj, i )
        pObj->uSimInfo = Gli_ManUpdateRandomInput( pObj->uSimInfo, 0.5 );
    Gli_ManForEachRo( p, pObj, i )
        pObj->uSimInfo = 0;
    for ( f = 0; f < nPref; f++ )
    {
        // simulate one frame
        Gli_ManForEachNode( p, pObj, i )
            pObj->uSimInfo = Gli_ManSimulateSeqNode( p, pObj );
        Gli_ManForEachRi( p, pObj, i )
            pObj->uSimInfo = Gli_ObjFanin(pObj, 0)->uSimInfo;
        // initialize the next frame
        Gli_ManForEachPi( p, pObj, i )
            pObj->uSimInfo = Gli_ManUpdateRandomInput( pObj->uSimInfo, 0.5 );
        Gli_ManForEachRiRo( p, pObjRi, pObjRo, i )
            pObjRo->uSimInfo = pObjRi->uSimInfo;
    }
    // save simulation data after nPref timeframes
    if ( p->pSimInfoPrev == NULL )
        p->pSimInfoPrev = ABC_ALLOC( unsigned, Gli_ManCiNum(p) );
    Gli_ManForEachCi( p, pObj, i )
        p->pSimInfoPrev[i] = pObj->uSimInfo;
}